

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::get_4(disp *this,int x,int y,int z,int t)

{
  long in_RDI;
  int in_stack_0000006c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_fffffffffffffed8;
  string local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_e8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __rhs = &local_b8;
  ts<int>(in_stack_0000006c);
  std::operator+(in_stack_fffffffffffffed8,__rhs);
  ts<int>(in_stack_0000006c);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ts<int>(in_stack_0000006c);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ts<int>(in_stack_0000006c);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void get_4(int x,int y,int z,int t) { v_="get_4" + ts(x)+ts(y)+ts(z)+ts(t); }